

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O0

void __thiscall Example::initializeUniverse(Example *this)

{
  S_Polyhedron *this_00;
  STP_BV *pSVar1;
  STP_BV *this_01;
  allocator<char> local_1b1;
  value_type local_1b0;
  allocator<char> local_189;
  value_type local_188;
  undefined8 local_168;
  double local_160;
  double local_158 [10];
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [32];
  STP_BV *local_b8;
  STP_BV *stp2;
  STP_BV *stp1;
  value_type local_a0;
  undefined8 local_80;
  double local_78;
  double local_70 [4];
  allocator<char> local_49;
  string local_48 [48];
  S_Polyhedron *local_18;
  S_Polyhedron *poly;
  Example *this_local;
  
  poly = (S_Polyhedron *)this;
  this_00 = (S_Polyhedron *)operator_new(0xf0);
  sch::S_Polyhedron::S_Polyhedron(this_00);
  local_18 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"sample_polyhedron.otp",&local_49);
  (**(code **)(*(long *)this_00 + 0x30))(this_00,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  local_70[3] = 0.1;
  local_70[2] = 0.7;
  local_70[1] = 0.9;
  sch::S_Object::setPosition((double *)local_18,local_70 + 3,local_70 + 2);
  local_70[0] = 0.1;
  local_78 = 1.0;
  local_80 = 0xbfe6666666666666;
  sch::S_Object::setOrientation((double *)local_18,local_70,&local_78);
  sch::CD_Scene::addObject((S_Object *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"poly",(allocator<char> *)((long)&stp1 + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->objName,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&stp1 + 7));
  pSVar1 = (STP_BV *)operator_new(0xe8);
  sch::STP_BV::STP_BV(pSVar1);
  stp2 = pSVar1;
  this_01 = (STP_BV *)operator_new(0xe8);
  sch::STP_BV::STP_BV(this_01);
  pSVar1 = stp2;
  local_b8 = this_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"sample_stpbv1.txt",&local_d9);
  (**(code **)(*(long *)pSVar1 + 0x30))(pSVar1,local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pSVar1 = local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"sample_stpbv2.txt",&local_101);
  (**(code **)(*(long *)pSVar1 + 0x30))(pSVar1,local_100);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  local_158[9] = 0.15;
  local_158[8] = 0.6;
  local_158[7] = 0.8;
  sch::S_Object::setPosition((double *)stp2,local_158 + 9,local_158 + 8);
  local_158[6] = 0.4;
  local_158[5] = -1.1;
  local_158[4] = 1.2;
  sch::S_Object::setOrientation((double *)stp2,local_158 + 6,local_158 + 5);
  local_158[3] = 0.4;
  local_158[2] = 0.0;
  local_158[1] = 0.1;
  sch::S_Object::setPosition((double *)local_b8,local_158 + 3,local_158 + 2);
  local_158[0] = 0.7;
  local_160 = -0.2;
  local_168 = 0xbff199999999999a;
  sch::S_Object::setOrientation((double *)local_b8,local_158,&local_160);
  sch::CD_Scene::addObject((S_Object *)this);
  sch::CD_Scene::addObject((S_Object *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"stp1",&local_189);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->objName,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"stp2",&local_1b1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->objName,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  return;
}

Assistant:

void Example::initializeUniverse()
{
  //Scene (see example1.exe)

  //**********
  //Polyhedrons

  //Create a polyhedron.
  S_Polyhedron * poly = new S_Polyhedron ();

  //At creationm the polyhedron is empty, it has to be loaded from a file.
  poly->constructFromFile("sample_polyhedron.otp");

  //The file must have been generated with sch-creator, for details see
  //https://github.com/jrl-umi3218/sch-creator

  //An elternative solution is to use qconvex software from Qhull using the
  //following instruction:
  //"qconvex.exe TI <input_filename> TO <output_filename> Qt o f"
  //see http://www.qhull.org/html/qconvex.htm for details on using qconvex.

  //Position/Orientation
  poly->setPosition(0.1,0.7,0.9);
  poly->setOrientation(0.1,1,-0.7);

  //Add to scene
  sObj.addObject(poly);
  objName.push_back("poly");

  //*********
  //Strictly Convex Hull (STP-BV)
  //(see README.md for details)

  //Create a STP_BVs
  STP_BV* stp1 = new STP_BV();
  STP_BV* stp2 = new STP_BV();

  //Similarly to polyhedrons, it has to be loaded from file
  stp1->constructFromFile("sample_stpbv1.txt");
  stp2->constructFromFile("sample_stpbv2.txt");


  //Position/Orientation
  stp1->setPosition(0.15,0.6,0.8);
  stp1->setOrientation(0.4,-1.1,1.2);

  //Position/Orientation
  stp2->setPosition(0.4,0.0,0.1);
  stp2->setOrientation(0.7,-0.2,-1.1);

  //Add to scene
  sObj.addObject(stp1);
  sObj.addObject(stp2);
  objName.push_back("stp1");
  objName.push_back("stp2");
}